

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3IsAppendable(Fts3Table *p,sqlite3_int64 iEnd,int *pbRes)

{
  int iVar1;
  int local_34;
  sqlite3_stmt *psStack_30;
  int rc;
  sqlite3_stmt *pCheck;
  int *piStack_20;
  int bRes;
  int *pbRes_local;
  sqlite3_int64 iEnd_local;
  Fts3Table *p_local;
  
  pCheck._4_4_ = 0;
  psStack_30 = (sqlite3_stmt *)0x0;
  piStack_20 = pbRes;
  pbRes_local = (int *)iEnd;
  iEnd_local = (sqlite3_int64)p;
  local_34 = fts3SqlStmt(p,0x22,&stack0xffffffffffffffd0,(sqlite3_value **)0x0);
  if (local_34 == 0) {
    sqlite3_bind_int64(psStack_30,1,(sqlite_int64)pbRes_local);
    iVar1 = sqlite3_step(psStack_30);
    if (iVar1 == 100) {
      pCheck._4_4_ = 1;
    }
    local_34 = sqlite3_reset(psStack_30);
  }
  *piStack_20 = pCheck._4_4_;
  return local_34;
}

Assistant:

static int fts3IsAppendable(Fts3Table *p, sqlite3_int64 iEnd, int *pbRes){
  int bRes = 0;                   /* Result to set *pbRes to */
  sqlite3_stmt *pCheck = 0;       /* Statement to query database with */
  int rc;                         /* Return code */

  rc = fts3SqlStmt(p, SQL_SEGMENT_IS_APPENDABLE, &pCheck, 0);
  if( rc==SQLITE_OK ){
    sqlite3_bind_int64(pCheck, 1, iEnd);
    if( SQLITE_ROW==sqlite3_step(pCheck) ) bRes = 1;
    rc = sqlite3_reset(pCheck);
  }
  
  *pbRes = bRes;
  return rc;
}